

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCacheAlign.h
# Opt level: O0

void highs::cache_aligned::free(void *__ptr)

{
  void *freeptr;
  
  if (__ptr != (void *)0x0) {
    operator_delete(*(void **)((long)__ptr + -8));
  }
  return;
}

Assistant:

static void free(void* aligned_ptr) {
    using std::uintptr_t;

    if (aligned_ptr) {
      void* freeptr;
      std::memcpy(&freeptr,
                  reinterpret_cast<char*>(aligned_ptr) - sizeof(uintptr_t),
                  sizeof(uintptr_t));
      ::operator delete(freeptr);
    }
  }